

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O3

void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter
               (TPZVec<int> *firstHCurlFunc,TPZVec<int> *conOrders,TPZVec<int> *filteredFuncs)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  int iVar7;
  MElementType MVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar25;
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  uVar6 = pztopology::TPZCube::NumSides(2);
  iVar7 = pztopology::TPZCube::NumSides(1);
  uVar13 = 0;
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs,0);
  if (0 < (int)uVar6) {
    uVar19 = 0;
    uVar13 = 0;
    do {
      lVar9 = (long)iVar7 + uVar19;
      iVar25 = firstHCurlFunc->fStore[lVar9];
      iVar26 = conOrders->fStore[lVar9];
      MVar8 = pztopology::TPZCube::Type((int)lVar9 + 8);
      if (MVar8 == EQuadrilateral) {
        (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs);
        piVar1 = filteredFuncs->fStore;
        lVar9 = 0;
        iVar11 = 0;
        iVar21 = iVar25;
        do {
          if (0 < iVar26) {
            lVar17 = 0;
            do {
              piVar1[(int)uVar13 + lVar17] = iVar21 + (int)lVar17;
              lVar17 = lVar17 + 1;
            } while (iVar26 != (int)lVar17);
            uVar13 = (ulong)(uint)((int)uVar13 + (int)lVar17);
          }
          iVar11 = iVar11 + 1;
          iVar21 = iVar21 + iVar26;
        } while (iVar11 != 3);
        iVar21 = iVar26 + -1;
        uVar20 = iVar21 * iVar21 * 2;
        if (0 < (int)uVar20) {
          piVar1 = filteredFuncs->fStore;
          uVar10 = 0;
          do {
            if ((uVar10 & 1) != 0) {
              piVar1[(int)uVar13] = iVar25 + iVar26 * 4 + uVar10;
              uVar13 = (ulong)((int)uVar13 + 1);
            }
            uVar10 = uVar10 + 1;
          } while (uVar20 != uVar10);
        }
        if (1 < iVar26) {
          piVar1 = filteredFuncs->fStore;
          do {
            piVar1[(int)uVar13 + lVar9] = uVar20 + iVar25 + iVar26 * 5 + -1 + (int)lVar9;
            lVar9 = lVar9 + 1;
          } while (iVar21 != (int)lVar9);
          uVar13 = (ulong)(uint)((int)uVar13 + (int)lVar9);
        }
      }
      else {
        if (MVar8 != ETriangle) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "static void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::HighOrderFunctionsFilter(const TPZVec<int> &, const TPZVec<int> &, TPZVec<int> &) [TSHAPE = pzshape::TPZShapeCube]"
                     ,0xab);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," error. Not yet implemented",0x1b);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurlNoGrads.cpp"
                     ,0x138);
        }
        if (1 < iVar26) {
          iVar11 = iVar26 + -1;
          (*filteredFuncs->_vptr_TPZVec[3])
                    (filteredFuncs,(long)(int)(((uint)((iVar26 + 2) * iVar11) >> 1) + (int)uVar13));
          piVar1 = filteredFuncs->fStore;
          iVar21 = iVar25;
          bVar5 = true;
          do {
            bVar16 = bVar5;
            uVar12 = uVar13;
            iVar15 = (int)uVar12;
            lVar9 = 0;
            do {
              piVar1[iVar15 + lVar9] = iVar21 + (int)lVar9;
              lVar9 = lVar9 + 1;
            } while (iVar11 != (int)lVar9);
            iVar21 = iVar21 + iVar11;
            uVar13 = (ulong)(uint)(iVar15 + (int)lVar9);
            bVar5 = false;
          } while (bVar16);
          uVar20 = (iVar26 + -2) * iVar11;
          uVar13 = (uVar12 & 0xffffffff) + lVar9;
          if (0 < (int)uVar20) {
            piVar1 = filteredFuncs->fStore;
            uVar10 = 0;
            do {
              if ((uVar10 & 1) != 0) {
                piVar1[(int)uVar13] = iVar11 * 3 + iVar25 + uVar10;
                uVar13 = (ulong)((int)uVar13 + 1);
              }
              uVar10 = uVar10 + 1;
            } while (uVar20 != uVar10);
          }
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar6);
  }
  iVar25 = conOrders->fStore[(int)(iVar7 + uVar6)];
  iVar7 = firstHCurlFunc->fStore[(int)(iVar7 + uVar6)];
  iVar21 = iVar25 * iVar25;
  (*filteredFuncs->_vptr_TPZVec[3])(filteredFuncs);
  iVar26 = iVar21 * 6;
  if (iVar21 < iVar26) {
    piVar1 = filteredFuncs->fStore;
    lVar9 = 0;
    do {
      piVar1[(int)uVar13 + lVar9] = (int)lVar9 + iVar21 + iVar7;
      lVar9 = lVar9 + 1;
    } while (iVar21 * 5 != (int)lVar9);
    uVar13 = (ulong)(uint)((int)uVar13 + (int)lVar9);
  }
  iVar11 = (int)uVar13;
  iVar23 = iVar25 + -1;
  iVar21 = iVar23 * iVar23 * 3;
  iVar15 = iVar21 * iVar23;
  uVar6 = (iVar25 * 2 + -1) * iVar23;
  if (0 < iVar15) {
    piVar1 = filteredFuncs->fStore;
    uVar19 = 0;
    iVar18 = 2;
    iVar22 = iVar15;
    iVar14 = iVar7 + iVar26;
    do {
      if ((int)(uVar19 / 3) * 3 + iVar18 != 0) {
        piVar1[(int)uVar13] = iVar14;
        uVar13 = (ulong)((int)uVar13 + 1);
      }
      iVar11 = (int)uVar13;
      uVar19 = (ulong)((int)uVar19 + 1);
      iVar14 = iVar14 + 1;
      iVar18 = iVar18 + -1;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
  }
  if (0 < (int)uVar6) {
    piVar1 = filteredFuncs->fStore;
    lVar9 = 0;
    do {
      piVar1[iVar11 + lVar9] = iVar15 + iVar7 + iVar26 + (int)lVar9;
      auVar4 = _DAT_014d2b10;
      auVar3 = _DAT_014d28c0;
      auVar2 = _DAT_014d28b0;
      lVar9 = lVar9 + 1;
    } while (uVar6 != (uint)lVar9);
    if (0 < (int)uVar6) {
      piVar1 = filteredFuncs->fStore;
      lVar17 = (ulong)uVar6 - 1;
      auVar24._8_4_ = (int)lVar17;
      auVar24._0_8_ = lVar17;
      auVar24._12_4_ = (int)((ulong)lVar17 >> 0x20);
      iVar7 = (iVar25 * 2 + iVar21 + -1) * iVar23 + iVar7 + iVar26;
      iVar11 = iVar11 + (uint)lVar9;
      uVar13 = 0;
      auVar24 = auVar24 ^ _DAT_014d28c0;
      do {
        iVar26 = (int)uVar13;
        auVar27._8_4_ = iVar26;
        auVar27._0_8_ = uVar13;
        auVar27._12_4_ = (int)(uVar13 >> 0x20);
        auVar28 = (auVar27 | auVar2) ^ auVar3;
        iVar25 = auVar24._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar25 && auVar24._0_4_ < auVar28._0_4_ ||
                    iVar25 < auVar28._4_4_) & 1)) {
          piVar1[(long)iVar11 + uVar13] = iVar7 + iVar26;
        }
        if ((auVar28._12_4_ != auVar24._12_4_ || auVar28._8_4_ <= auVar24._8_4_) &&
            auVar28._12_4_ <= auVar24._12_4_) {
          piVar1[(long)iVar11 + uVar13 + 1] = iVar7 + iVar26 + 1;
        }
        auVar27 = (auVar27 | auVar4) ^ auVar3;
        iVar21 = auVar27._4_4_;
        if (iVar21 <= iVar25 && (iVar21 != iVar25 || auVar27._0_4_ <= auVar24._0_4_)) {
          piVar1[(long)iVar11 + uVar13 + 2] = iVar7 + iVar26 + 2;
          piVar1[(long)iVar11 + uVar13 + 3] = iVar7 + iVar26 + 3;
        }
        uVar13 = uVar13 + 4;
      } while ((uVar6 + 3 & 0xfffffffc) != uVar13);
    }
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::HighOrderFunctionsFilter(
  const TPZVec<int> &firstHCurlFunc,
  const TPZVec<int> &conOrders,
  TPZVec<int> &filteredFuncs){
  
  constexpr auto dim = TSHAPE::Dimension;
  constexpr auto nNodes = TSHAPE::NCornerNodes;
  constexpr auto nConnects = TSHAPE::NSides - nNodes;
  const auto nFaces = TSHAPE::NumSides(2);
  const auto nEdges = TSHAPE::NumSides(1);

  filteredFuncs.Resize(0);
  /*
    face connects: 
  */
  auto fcount = 0;
  for(auto iface = 0; iface < nFaces; iface++){
    const auto icon = nEdges + iface;
    const auto side = icon + nNodes;
    const auto firstSideShape = firstHCurlFunc[icon];
    const auto order = conOrders[icon];

    switch(TSHAPE::Type(side)){
    case ETriangle:{
      //there are no face functions for k < 2
      if(order < 2) break;
      /**
         we remove one internal function for each h1 face function of order k+1
         since there are (k-1)(k-2)/2 functions per face in a face with order k,
         we remove k(k-1)/2.
         so:
         (k-1)*(k+1)-k*(k-1)/2 = (k-1)(k+2)/2.
      */
      const auto nfacefuncs =  (order - 1) * (order+2) / 2;
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 3(k-1) vfe funcs.
         that means that, at each k, there are 3 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{3};
      for (auto ie = 0; ie < nedges - 1; ie++){
        const int nfuncs = order-1;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /**
         there are already 2(k-1) filtered functions. we discarded (k-1).
         so that means we need more (k-1)(k-2)/2 functions, because
         2(k-1) + (k-1)(k-2)/2 = (k-1)(k+2)/2. 
         That means we can take exactly half of the phi_fi functions. 
         for each k, there are 2(k-2) phi_fi func. so...
      **/
      auto firstVfiK = firstSideShape + 3*(order-1);
      const auto nPhiFi = (order-1)*(order-2);
      for(auto ifunc = 0; ifunc < nPhiFi; ifunc++){
        if(ifunc%2 == 0) continue;//we always skip one of them
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      break;
    }
    case EQuadrilateral:{
      /*
        from the 2k(k+1) functions, we filter out k^2 gradients of h1, thus
        there are k(k+2) remaining functions.
        from the 2k(k-1) phi_Fi functions, we can remove half of them,
        that sums k(k-1). so, we remove aditionally k phi_Fe functions of a given edge.
        k(k-1) + 3k = k(k+2) as we wanted.

        we need to take into account x- and y -dirs
      */
      const auto nfacefuncs =  order * (order+2);
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      filteredFuncs.Resize(fcount+nfacefuncs);

      /**
         we will iterate over the phi_fe hcurl functions. there are 4k vfe funcs.
         that means that, at each k, there are 4 new vfe functions. we can remove 
         one of them for each polynomial order.
         they are sorted per edge, so we can just skip the last edge, which
         is associated with the x direction
      */
      auto firstVfeK = firstSideShape;
      constexpr int nedges{4};
      for (auto ie = 0; ie < nedges-1; ie++){
        const int nfuncs = order;
        for(auto ifunc = 0; ifunc < nfuncs; ifunc++){
          filteredFuncs[fcount] = firstVfeK+ifunc;
          fcount++;
        }
        firstVfeK += nfuncs;//next edge
      }
      /*now we take half of the phi_fi functions.
        there are 2(k-1)(k-1) scalar functions that will be multiplied by
        vectors in both the x and y directions. we will skip all in the x dir.
        and then, 2*(k-1) functions that will be half in x dir and half in y dir.
        we also skip all in the x dir
       */
      auto firstVfiK = firstSideShape + 4*order;
      const auto nPhiFiK = 2*(order-1)*(order-1);
      const auto nPhiFiK1 = (order-1); // we will have nPhiFiK1 in x and nPhiFiK1 in y
      for(auto ifunc = 0; ifunc < nPhiFiK; ifunc++){
        if(ifunc%2==0) continue;//we always skip the one in x dir
        filteredFuncs[fcount] = firstVfiK+ifunc;
        fcount++;
      }
      //taking only the ones in the y-dir
      for(auto ifunc = 0; ifunc < nPhiFiK1; ifunc++){
        filteredFuncs[fcount] = firstVfiK+nPhiFiK+nPhiFiK1+ifunc;
        fcount++;
      }
#ifdef PZDEBUG
      if(fcount != filteredFuncs.size()){
        PZError<<__PRETTY_FUNCTION__
               <<"\nERROR: wrong function count.\n"
               <<"fcount = "<<fcount<<" filtfuncsize = "<<filteredFuncs.size()<<'\n'
               <<"Aborting..."<<std::endl;
        DebugStop();
      }
#endif
      break;
    }
    default:
      PZError<<__PRETTY_FUNCTION__<<" error. Not yet implemented"<<std::endl;
      DebugStop();
    }

  }
  
  if constexpr (dim < 3) return;

  if constexpr (TSHAPE::Type() == ETetraedro){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)(k-2)(k-3)/6 functions in a h1 element with order k,
       we remove k(k-1)(k-2)/6.
       so:
       (k-1)(k-2)(k+1)/2 - k(k-1)(k-2)/6 = (k-1)(k-2)(2k+3)/6.

       since we will remove k(k-1)(k-2)/6, for each  k   we remove (k-1)(k-2)/2 funcs.

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   k-1                 new funcs
       phi_kf      2(k-1)(k-2)         2(k-2)(k-3)         4(k-2)
       phi_ki      (k-1)(k-2)(k-3)/2   (k-2)(k-3)(k-4)/2   3(k-2)(k-3)/2
            
       that means that if we remove, for each k, (k-2) phi_kf 
       (for instance, all phi_kf associated with a given face),
       we need to remove (k-1)(k-2)/2 - (k-2) = (k-2)(k-3)/2
       which is exactly one third of the phi_ki.
            
    */

    const auto nintfuncs =  (order - 1) * (order-2) * (2*order+ 3) / 6;

    filteredFuncs.Resize(fcount+nintfuncs);

    /**
       we will iterate over the phi_kf hcurl functions.
       we chose to remove all the functions for a given face
       since they are sorted by face, we can simply skip (k-1)(k-2)/2 functions...
    */
    const auto firstvkf = firstSideShape;
    const auto offset = (order-1)*(order-2)/2;
    const auto nvkf = 2*(order-1)*(order-2);
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions
    */

    auto firstVki = firstSideShape + nvkf;
    for(auto ik = 4; ik <= order; ik++){
      //we chose to remove all the functions for a given direction
      const auto newvki = 3*(ik-2)*(ik-3)/2;
      for(auto ifunc = 0; ifunc < newvki; ifunc++){
        if(ifunc%3 == 0) continue;
        filteredFuncs[fcount] = firstVki+ifunc;
        fcount++;
      }
      //we skip to the higher order ones
      firstVki += newvki;
    }
  }
  else if constexpr (TSHAPE::Type() == ECube){
    const auto icon = nEdges + nFaces;
    const auto order = conOrders[icon];
    const auto firstSideShape = firstHCurlFunc[icon];
    /**
       we remove one internal function for each h1 internal function of order k+1
       since there are (k-1)^3 functions in a h1 element with order k,
       we remove k^3
       so:
       3k^2(k+1) - k^3 = k^2(2k+3)

       we have two kinds of internal functions. phi_kf and phi_ki.
       func        k                   
       phi_kf      6k^2
       phi_ki      3k^2(k-1)

       if we remove all phi_kf associated with a given face (k^2 funcs)
       and all phi_ki associated with a given direction (k^2(k-1)),
       we have removed all k^3 functions that we needed to.
    */

    const auto nintfuncs =  order*order*(2*order+3);

    filteredFuncs.Resize(fcount+nintfuncs);


    const auto firstvkf = firstSideShape;
    
    const auto offset = order*order;//we skip the first face, z direction
    const auto nvkf = 6*order*order;
    for(auto ifunc = offset; ifunc < nvkf; ifunc++){
      filteredFuncs[fcount] = firstvkf + ifunc;
      fcount++;
    }
    

    /**
       we now iterate over the phi_ki hcurl functions. we have them separated:
       3(k-1)^3 functions of order k and 3(k-1)(2k-1) ( (k-1)(2k-1) in each direction).
       we will filter all funcs in z direction
    */

    const auto firstVki = firstSideShape + nvkf;
    const auto nvkik = 3*(order-1)*(order-1)*(order-1);
    const auto nvkik1 = (order-1)*(2*order-1);//for each direction
    
    for(auto ifunc = 0; ifunc < nvkik; ifunc++){
      if(ifunc%3 == 2) continue;//skip z direction
      filteredFuncs[fcount] = firstVki+ifunc;
      fcount++;
    }

    const auto firstxfunc = firstVki+nvkik;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//x dir
      filteredFuncs[fcount] = firstxfunc+ifunc;
      fcount++;
    }
    const auto firstyfunc = firstxfunc+nvkik1;
    for(auto ifunc = 0; ifunc < nvkik1; ifunc++){//y dir
      filteredFuncs[fcount] = firstyfunc+ifunc;
      fcount++;
    }
  }
}